

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgReadDeviceID(ZvgID_s *devID)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  ulong uVar5;
  uint uVar6;
  uint idLen;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  uVar2 = zvgGetDeviceID(ZvgIO.mBfr,0x100,&local_34);
  if (((uVar2 == 0) && (uVar2 = zvgSetEcpMode(), uVar2 == 0)) &&
     (uVar2 = 0x1d, ZvgIO.mBfr._0_4_ == 0x3a47464d)) {
    uVar5 = 0;
    do {
      if ((ZvgIO.mBfr[uVar5 + 4] == ';') || (local_34 <= (int)uVar5 + 4U)) {
        uVar6 = (int)uVar5 + 4;
        goto LAB_00104b5f;
      }
      devID->mfg[uVar5] = ZvgIO.mBfr[uVar5 + 4];
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    uVar5 = 0x10;
    uVar6 = 0x14;
LAB_00104b5f:
    devID->mfg[uVar5 & 0xffffffff] = '\0';
    iVar3 = strncmp((char *)(ZvgIO.mBfr + (uVar6 + 3)),"CMD:",4);
    if (uVar6 + 3 < local_34 && iVar3 == 0) {
      uVar5 = 0;
      do {
        cVar1 = *(char *)((ulong)uVar6 + 0x10932b + uVar5);
        iVar3 = (int)uVar5;
        if ((cVar1 == ';') || (local_34 <= uVar6 + 7 + iVar3)) goto LAB_00104be3;
        devID->cmd[uVar5] = cVar1;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x10);
      iVar3 = 0x10;
      uVar5 = 0x10;
LAB_00104be3:
      iVar3 = uVar6 + iVar3;
      devID->cmd[uVar5 & 0xffffffff] = '\0';
      iVar4 = strncmp((char *)(ZvgIO.mBfr + (iVar3 + 10U)),"MDL:",4);
      if (iVar3 + 10U < local_34 && iVar4 == 0) {
        uVar5 = 0;
        do {
          cVar1 = *(char *)((ulong)(iVar3 + 7U) + 0x10932b + uVar5);
          iVar4 = (int)uVar5;
          if ((cVar1 == ';') || (local_34 <= (uint)(iVar3 + 0xe + iVar4))) goto LAB_00104c64;
          devID->mdl[uVar5] = cVar1;
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x10);
        iVar4 = 0x10;
        uVar5 = 0x10;
LAB_00104c64:
        iVar4 = iVar3 + 7U + iVar4;
        devID->mdl[uVar5 & 0xffffffff] = '\0';
        iVar3 = strncmp((char *)(ZvgIO.mBfr + (iVar4 + 10U)),"VER:",4);
        if (iVar4 + 10U < local_34 && iVar3 == 0) {
          uVar5 = strtoul((char *)(ZvgIO.mBfr + (iVar4 + 0xe)),(char **)0x0,0x10);
          devID->fVer = (uint)uVar5;
          if (iVar4 + 0x12U < local_34 && ZvgIO.mBfr[iVar4 + 0x12U] == ',') {
            uVar5 = strtoul((char *)(ZvgIO.mBfr + (iVar4 + 0x13)),(char **)0x0,0x10);
            devID->bVer = (uint)uVar5;
            if (iVar4 + 0x17U < local_34 && ZvgIO.mBfr[iVar4 + 0x17U] == ',') {
              uVar5 = strtoul((char *)(ZvgIO.mBfr + (iVar4 + 0x18)),(char **)0x0,0x10);
              devID->vVer = (uint)uVar5;
              if (((iVar4 + 0x1cU < local_34 && ZvgIO.mBfr[iVar4 + 0x1cU] == ';') &&
                  (iVar3 = strncmp((char *)(ZvgIO.mBfr + (iVar4 + 0x1fU)),"SWS:",4),
                  iVar4 + 0x1fU < local_34)) && (iVar3 == 0)) {
                uVar5 = strtoul((char *)(ZvgIO.mBfr + (iVar4 + 0x23)),(char **)0x0,0x10);
                devID->sws = (uint)uVar5;
                if (((iVar4 + 0x25U < local_34 && ZvgIO.mBfr[iVar4 + 0x25U] == ';') &&
                    (iVar3 = strncmp((char *)(ZvgIO.mBfr + (iVar4 + 0x28U)),"ESB:",4),
                    iVar4 + 0x28U < local_34)) && (iVar3 == 0)) {
                  uVar5 = strtoul((char *)(ZvgIO.mBfr + (iVar4 + 0x2c)),(char **)0x0,0x10);
                  devID->fESB = (uint)uVar5;
                  if (iVar4 + 0x30U < local_34 && ZvgIO.mBfr[iVar4 + 0x30U] == ',') {
                    uVar5 = strtoul((char *)(ZvgIO.mBfr + (iVar4 + 0x31)),(char **)0x0,0x10);
                    devID->vESB = (uint)uVar5;
                    uVar2 = 0;
                    if (local_34 <= iVar4 + 0x35U) {
                      uVar2 = 0x1d;
                    }
                    if (ZvgIO.mBfr[iVar4 + 0x35U] != ';') {
                      uVar2 = 0x1d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

uint zvgReadDeviceID( ZvgID_s *devID)
{
	uint	idLen, err, ii, jj;

	err = zvgGetDeviceID( ZvgIO.mBfr, ZVG_MAX_BFRSZ, &idLen);

	if (err)
		return (err);

	// return to ECP mode

	err = zvgSetEcpMode();

	if (err)
		return (err);

	// parse buffer

	ii = 0;

	// Get "MFG:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MFG:", 4) != 0)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mfg[jj++] = ZvgIO.mBfr[ii++];

	devID->mfg[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "CMD:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "CMD:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->cmd[jj++] = ZvgIO.mBfr[ii++];

	devID->cmd[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "MDL:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MDL:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mdl[jj++] = ZvgIO.mBfr[ii++];

	devID->mdl[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "VER:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "VER:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	devID->fVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->bVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "SWS:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "SWS:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->sws = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 2;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "ESB:" (Error Status Bits)

	if (strncmp( (char*)ZvgIO.mBfr + ii, "ESB:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->fESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	return (err);
}